

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O2

void __thiscall pg::PPQSolver::run(PPQSolver *this)

{
  bitset *this_00;
  bitset *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint *puVar6;
  size_t sVar7;
  ostream *poVar8;
  Error *this_01;
  long lVar9;
  int v;
  ulong uVar10;
  ulong uVar11;
  int v_1;
  Game *pGVar12;
  ulong uVar13;
  ulong uVar14;
  _label_vertex local_48;
  bitset *local_38;
  
  this->iterations = 0;
  pGVar12 = (this->super_Solver).game;
  uVar13 = pGVar12->n_vertices;
  uVar10 = uVar13 * 4;
  uVar14 = -(ulong)(uVar13 >> 0x3e != 0) | uVar10;
  piVar5 = (int *)operator_new__(uVar14);
  this->str = piVar5;
  for (lVar9 = 0; uVar10 - lVar9 != 0; lVar9 = lVar9 + 4) {
    *(undefined4 *)((long)piVar5 + lVar9) = 0xffffffff;
  }
  piVar5 = (int *)operator_new__(uVar14);
  this->r = piVar5;
  pbVar1 = (this->super_Solver).disabled;
  for (uVar11 = 0; (~((long)uVar13 >> 0x3f) & uVar13) != uVar11; uVar11 = uVar11 + 1) {
    iVar4 = -1;
    if ((pbVar1->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
      iVar4 = pGVar12->_priority[uVar11];
    }
    piVar5[uVar11] = iVar4;
  }
  piVar5 = (int *)operator_new__(uVar14);
  this->u = piVar5;
  for (lVar9 = 0; uVar10 - lVar9 != 0; lVar9 = lVar9 + 4) {
    *(undefined4 *)((long)piVar5 + lVar9) = 0xffffffff;
  }
  (this->Q).pointer = 0;
  puVar6 = (this->Q).queue;
  if (puVar6 != (uint *)0x0) {
    operator_delete__(puVar6);
    pGVar12 = (this->super_Solver).game;
  }
  puVar6 = (uint *)operator_new__(uVar10 & 0x3fffffffc);
  (this->Q).queue = puVar6;
  bitset::resize(&this->L,pGVar12->n_vertices);
  bitset::resize(&this->R,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->U,((this->super_Solver).game)->n_vertices);
  local_38 = &this->W0;
  bitset::resize(local_38,((this->super_Solver).game)->n_vertices);
  this_00 = &this->W1;
  bitset::resize(this_00,((this->super_Solver).game)->n_vertices);
  pbVar1 = &this->G;
  bitset::resize(pbVar1,((this->super_Solver).game)->n_vertices);
  bitset::operator=(pbVar1,(this->super_Solver).disabled);
  bitset::flip(pbVar1);
  bVar2 = bitset::any(pbVar1);
  if (bVar2) {
    piVar5 = this->r;
    lVar9 = ((this->super_Solver).game)->n_vertices;
    sVar7 = bitset::find_last(pbVar1);
    iVar4 = (int)((this->super_Solver).game)->n_vertices;
    solve(this,(int)lVar9 + -1,piVar5[sVar7],0x7fffffff,iVar4,iVar4);
  }
  if (1 < (this->super_Solver).trace) {
    for (uVar10 = 0; (long)uVar10 < ((this->super_Solver).game)->n_vertices; uVar10 = uVar10 + 1) {
      uVar13 = uVar10 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar13] >> (uVar10 & 0x3f) & 1) == 0) {
        uVar14 = 1L << (uVar10 & 0x3f);
        poVar8 = std::operator<<((this->super_Solver).logger,"vertex ");
        local_48.g = (this->super_Solver).game;
        iVar4 = (int)uVar10;
        local_48.v = iVar4;
        poVar8 = operator<<(poVar8,&local_48);
        std::operator<<(poVar8," is solved by");
        if (((this->W0)._bits[uVar13] & uVar14) != 0) {
          std::operator<<((this->super_Solver).logger," even");
          iVar3 = Solver::owner(&this->super_Solver,iVar4);
          if (iVar3 == 0) {
            std::operator<<((this->super_Solver).logger," (");
            poVar8 = (this->super_Solver).logger;
            if (this->str[uVar10] == -1) {
              std::operator<<(poVar8,"-1");
            }
            else {
              local_48.g = (this->super_Solver).game;
              local_48.v = this->str[uVar10];
              operator<<(poVar8,&local_48);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        if ((this_00->_bits[uVar13] & uVar14) != 0) {
          std::operator<<((this->super_Solver).logger," odd");
          iVar4 = Solver::owner(&this->super_Solver,iVar4);
          if (iVar4 == 1) {
            std::operator<<((this->super_Solver).logger," (");
            poVar8 = (this->super_Solver).logger;
            if (this->str[uVar10] == -1) {
              std::operator<<(poVar8,"-1");
            }
            else {
              local_48.g = (this->super_Solver).game;
              local_48.v = this->str[uVar10];
              operator<<(poVar8,&local_48);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
    }
  }
  for (uVar10 = 0; (long)uVar10 < ((this->super_Solver).game)->n_vertices; uVar10 = uVar10 + 1) {
    uVar13 = uVar10 >> 6;
    if ((((this->super_Solver).disabled)->_bits[uVar13] >> (uVar10 & 0x3f) & 1) == 0) {
      uVar14 = 1L << (uVar10 & 0x3f);
      if ((local_38->_bits[uVar13] & uVar14) != 0) {
        Solver::solve(&this->super_Solver,(int)uVar10,0,this->str[uVar10]);
      }
      if ((this_00->_bits[uVar13] & uVar14) != 0) {
        Solver::solve(&this->super_Solver,(int)uVar10,1,this->str[uVar10]);
      }
    }
  }
  poVar8 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar8 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar8);
  poVar8 = std::operator<<(poVar8," iterations.");
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar13 = ((this->super_Solver).game)->n_vertices;
  uVar10 = 0;
  do {
    if ((~((long)uVar13 >> 0x3f) & uVar13) == uVar10) {
      if (this->str != (int *)0x0) {
        operator_delete__(this->str);
      }
      return;
    }
    uVar11 = uVar10 >> 6;
    uVar14 = uVar10 & 0x3f;
    uVar10 = uVar10 + 1;
  } while ((((this->super_Solver).disabled)->_bits[uVar11] >> uVar14 & 1) != 0);
  this_01 = (Error *)__cxa_allocate_exception(0x40);
  Error::Error(this_01,"search was incomplete!",
               "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ppq.cpp"
               ,0x252);
  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
}

Assistant:

void
PPQSolver::run()
{
    iterations = 0;

    str = new int[nodecount()];
    std::fill(str, str+nodecount(), -1);

    r = new int[nodecount()];
    for (int v=0; v<nodecount(); v++) {
        if (!disabled[v]) r[v] = priority(v);
        else r[v] = -1;
    }

    u = new int[nodecount()];
    std::fill(u, u+nodecount(), -1);

    Q.resize(nodecount());
    L.resize(nodecount());
    R.resize(nodecount());
    U.resize(nodecount());

    W0.resize(nodecount());
    W1.resize(nodecount());
    
    G.resize(nodecount()); 
    G = disabled;
    G.flip();

    if (G.any()) {
        solve(nodecount()-1, r[G.find_last()], INT_MAX, nodecount(), nodecount()); // caller has INT_MAX priority...
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            logger << "vertex " << label_vertex(v) << " is solved by";
            if (W0[v]) {
                logger << " even";
                if (owner(v) == 0) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            if (W1[v]) {
                logger << " odd";
                if (owner(v) == 1) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            logger << std::endl;
        }
    }
#endif

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (W0[v]) Solver::solve(v, 0, str[v]);
        if (W1[v]) Solver::solve(v, 1, str[v]);
    }

    logger << "solved with " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    delete[] str;
}